

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void ImGui::RenderColorRectWithAlphaCheckerboard
               (ImDrawList *draw_list,ImVec2 p_min,ImVec2 p_max,ImU32 col,float grid_step,
               ImVec2 grid_off,float rounding,ImDrawFlags flags)

{
  ImU32 IVar1;
  ImU32 IVar2;
  uint uVar3;
  uint flags_00;
  uint flags_01;
  byte bVar4;
  float fVar5;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  float fVar6;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  ImVec2 local_c8;
  ImVec2 local_c0;
  ImVec2 local_b8;
  ImVec2 local_b0;
  ImVec2 local_a8;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  
  local_98 = p_max.y;
  flags_00 = 0xf0;
  if ((flags & 0x1f0U) != 0) {
    flags_00 = flags;
  }
  local_c8 = p_max;
  local_c0 = p_min;
  if (col < 0xff000000) {
    local_78._8_4_ = in_XMM1_Dc;
    local_78._0_8_ = p_max;
    local_78._12_4_ = in_XMM1_Dd;
    local_88._8_4_ = in_XMM0_Dc;
    local_88._0_8_ = p_min;
    local_88._12_4_ = in_XMM0_Dd;
    local_a8 = grid_off;
    fStack_94 = local_98;
    fStack_90 = local_98;
    fStack_8c = local_98;
    IVar1 = ImAlphaBlendColors(0xffcccccc,col);
    IVar1 = GetColorU32(IVar1,1.0);
    IVar2 = ImAlphaBlendColors(0xff808080,col);
    IVar2 = GetColorU32(IVar2,1.0);
    ImDrawList::AddRectFilled(draw_list,&local_c0,&local_c8,IVar1,rounding,flags_00);
    local_58 = local_a8.y + (float)local_88._4_4_;
    if (local_58 < local_98) {
      local_68 = (float)local_88._4_4_;
      fStack_64 = (float)local_88._4_4_;
      fStack_60 = (float)local_88._4_4_;
      fStack_5c = (float)local_88._4_4_;
      local_a8.x = local_a8.x + (float)local_88._0_4_;
      bVar4 = 0;
      fStack_54 = local_58;
      fStack_50 = local_58;
      fStack_4c = local_58;
      fVar7 = (float)local_78._0_4_;
      fVar8 = (float)local_88._0_4_;
      fVar9 = local_98;
      fVar10 = fStack_94;
      fVar11 = fStack_90;
      fVar12 = fStack_8c;
      do {
        fVar5 = fVar9;
        if (local_58 <= fVar9) {
          fVar5 = local_58;
        }
        local_b0.y = (float)(-(uint)(local_58 < local_68) & (uint)local_68 |
                            ~-(uint)(local_58 < local_68) & (uint)fVar5);
        uStack_44 = (uint)fStack_54 & (uint)fStack_64 | ~(uint)fStack_54 & (uint)fVar10;
        uStack_40 = (uint)fStack_50 & (uint)fStack_60 | ~(uint)fStack_50 & (uint)fVar11;
        uStack_3c = (uint)fStack_4c & (uint)fStack_5c | ~(uint)fStack_4c & (uint)fVar12;
        local_58 = local_58 + grid_step;
        fVar5 = local_58;
        if (fVar9 <= local_58) {
          fVar5 = fVar9;
        }
        if (local_b0.y < fVar5) {
          fVar13 = (float)bVar4 * grid_step + local_a8.x;
          local_48 = local_b0.y;
          if (fVar13 < fVar7) {
            do {
              fVar6 = fVar7;
              if (fVar13 <= fVar7) {
                fVar6 = fVar13;
              }
              local_b0.x = (float)(-(uint)(fVar13 < fVar8) & (uint)fVar8 |
                                  ~-(uint)(fVar13 < fVar8) & (uint)fVar6);
              local_b8.x = fVar13 + grid_step;
              if (fVar7 <= fVar13 + grid_step) {
                local_b8.x = fVar7;
              }
              if (local_b0.x < local_b8.x) {
                uVar3 = 0x100;
                if ((local_b0.y <= local_68) &&
                   (uVar3 = (local_b0.x <= fVar8 | 0x10) << 4, fVar7 <= local_b8.x)) {
                  uVar3 = uVar3 | 0x20;
                }
                if (fVar9 <= fVar5) {
                  if (local_b0.x <= fVar8) {
                    uVar3 = uVar3 | 0x40;
                  }
                  if (fVar7 <= local_b8.x) {
                    uVar3 = uVar3 | 0x80;
                  }
                }
                flags_01 = uVar3 & flags_00;
                if (uVar3 == 0x100) {
                  flags_01 = 0x100;
                }
                if (flags_00 == 0x100) {
                  flags_01 = 0x100;
                }
                local_b8.y = fVar5;
                ImDrawList::AddRectFilled(draw_list,&local_b0,&local_b8,IVar2,rounding,flags_01);
                fVar7 = (float)local_78._0_4_;
                fVar8 = (float)local_88._0_4_;
                fVar9 = local_98;
                fVar10 = fStack_94;
                fVar11 = fStack_90;
                fVar12 = fStack_8c;
                local_b0.y = local_48;
              }
              fVar13 = fVar13 + grid_step + grid_step;
            } while (fVar13 < fVar7);
          }
        }
        bVar4 = bVar4 ^ 1;
      } while (local_58 < fVar9);
    }
  }
  else {
    ImDrawList::AddRectFilled(draw_list,&local_c0,&local_c8,col,rounding,flags_00);
  }
  return;
}

Assistant:

void ImGui::RenderColorRectWithAlphaCheckerboard(ImDrawList* draw_list, ImVec2 p_min, ImVec2 p_max, ImU32 col, float grid_step, ImVec2 grid_off, float rounding, ImDrawFlags flags)
{
    if ((flags & ImDrawFlags_RoundCornersMask_) == 0)
        flags = ImDrawFlags_RoundCornersDefault_;
    if (((col & IM_COL32_A_MASK) >> IM_COL32_A_SHIFT) < 0xFF)
    {
        ImU32 col_bg1 = GetColorU32(ImAlphaBlendColors(IM_COL32(204, 204, 204, 255), col));
        ImU32 col_bg2 = GetColorU32(ImAlphaBlendColors(IM_COL32(128, 128, 128, 255), col));
        draw_list->AddRectFilled(p_min, p_max, col_bg1, rounding, flags);

        int yi = 0;
        for (float y = p_min.y + grid_off.y; y < p_max.y; y += grid_step, yi++)
        {
            float y1 = ImClamp(y, p_min.y, p_max.y), y2 = ImMin(y + grid_step, p_max.y);
            if (y2 <= y1)
                continue;
            for (float x = p_min.x + grid_off.x + (yi & 1) * grid_step; x < p_max.x; x += grid_step * 2.0f)
            {
                float x1 = ImClamp(x, p_min.x, p_max.x), x2 = ImMin(x + grid_step, p_max.x);
                if (x2 <= x1)
                    continue;
                ImDrawFlags cell_flags = ImDrawFlags_RoundCornersNone;
                if (y1 <= p_min.y) { if (x1 <= p_min.x) cell_flags |= ImDrawFlags_RoundCornersTopLeft; if (x2 >= p_max.x) cell_flags |= ImDrawFlags_RoundCornersTopRight; }
                if (y2 >= p_max.y) { if (x1 <= p_min.x) cell_flags |= ImDrawFlags_RoundCornersBottomLeft; if (x2 >= p_max.x) cell_flags |= ImDrawFlags_RoundCornersBottomRight; }

                // Combine flags
                cell_flags = (flags == ImDrawFlags_RoundCornersNone || cell_flags == ImDrawFlags_RoundCornersNone) ? ImDrawFlags_RoundCornersNone : (cell_flags & flags);
                draw_list->AddRectFilled(ImVec2(x1, y1), ImVec2(x2, y2), col_bg2, rounding, cell_flags);
            }
        }
    }
    else
    {
        draw_list->AddRectFilled(p_min, p_max, col, rounding, flags);
    }
}